

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

bool __thiscall
Function_Pool::FunctionTask::IsEqual
          (FunctionTask *this,Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,
          uint32_t startX2,uint32_t startY2,uint32_t width,uint32_t height)

{
  bool bVar1;
  OutputInfo *in_R8;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  Image *in_stack_00000058;
  undefined4 in_stack_00000064;
  uint32_t in_stack_00000078;
  uint32_t in_stack_00000080;
  TaskName in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb4;
  
  FunctionPoolTask::_setup
            ((FunctionPoolTask *)CONCAT44(in_stack_00000064,startY2),in_stack_00000058,this._4_4_,
             (uint32_t)this,in1,startX1,height,in_stack_00000078,in_stack_00000080);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)0x1264ec);
  AreaInfo::_size((AreaInfo *)0x1264f4);
  OutputInfo::resize((OutputInfo *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_00000010),
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_00000008));
  _process((FunctionTask *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_00000010),
           in_stack_ffffffffffffffac);
  bVar1 = OutputInfo::isEqual(in_R8);
  return bVar1;
}

Assistant:

bool IsEqual( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                      uint32_t width, uint32_t height )
        {
            _setup( in1, startX1, startY1, in2, startX2, startY2, width, height );
            _dataOut.resize( _infoIn1->_size() );
            _process( _IsEqual );
            return _dataOut.isEqual();
        }